

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall
QTreeViewPrivate::select
          (QTreeViewPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int iVar1;
  int iVar2;
  QAbstractItemView *this_00;
  QTreeViewItem *pQVar3;
  QAbstractItemModel *pQVar4;
  QPersistentModelIndexData *pQVar5;
  QPersistentModelIndexData *pQVar6;
  QPersistentModelIndex QVar7;
  QPersistentModelIndex QVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  QItemSelectionModel *pQVar14;
  pair<int,_int> *ppVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  undefined4 in_register_00000034;
  QArrayDataPointer<QItemSelectionRange> *this_01;
  ulong uVar20;
  long in_FS_OFFSET;
  QModelIndex ret;
  QModelIndex local_178;
  QModelIndex local_158;
  QPersistentModelIndex local_138;
  QPersistentModelIndex QStack_130;
  undefined8 local_128;
  QPersistentModelIndexData *pQStack_120;
  QAbstractItemModel *local_118;
  undefined8 local_108;
  QPersistentModelIndexData *pQStack_100;
  QAbstractItemModel *local_f8;
  undefined8 local_e8;
  QPersistentModelIndexData *pQStack_e0;
  QAbstractItemModel *local_d8;
  QArrayDataPointer<QItemSelectionRange> local_c8;
  QItemSelectionRange local_a8;
  undefined8 local_98;
  QPersistentModelIndexData *pQStack_90;
  QAbstractItemModel *local_88;
  QList<std::pair<int,_int>_> local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  uVar10 = viewIndex(this,(QModelIndex *)CONCAT44(in_register_00000034,__nfds));
  iVar11 = viewIndex(this,(QModelIndex *)__readfds);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  columnRanges(&local_78,this,(QModelIndex *)CONCAT44(in_register_00000034,__nfds),
               (QModelIndex *)__readfds);
  if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
    ppVar15 = local_78.d.ptr;
    do {
      iVar1 = ppVar15->first;
      iVar2 = ppVar15->second;
      local_98 = (QPersistentModelIndexData *)0xffffffffffffffff;
      pQStack_90 = (QPersistentModelIndexData *)0x0;
      local_88 = (QAbstractItemModel *)0x0;
      local_a8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::QPersistentModelIndex(&local_a8.tl);
      QPersistentModelIndex::QPersistentModelIndex(&local_a8.br);
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (QItemSelectionRange *)0x0;
      local_c8.size = 0;
      uVar17 = uVar10;
      if ((int)uVar10 <= iVar11) {
        do {
          if (((int)uVar17 < 0) ||
             (uVar20 = (ulong)uVar17, (ulong)(this->viewItems).d.size <= uVar20)) {
            local_e8 = (QPersistentModelIndexData *)0xffffffffffffffff;
            pQStack_e0 = (QPersistentModelIndexData *)0x0;
            local_d8 = (QAbstractItemModel *)0x0;
          }
          else {
            pQVar3 = (this->viewItems).d.ptr;
            local_d8 = pQVar3[uVar20].index.m.ptr;
            pQVar3 = pQVar3 + uVar20;
            local_e8 = *(QPersistentModelIndexData **)&pQVar3->index;
            pQStack_e0 = (QPersistentModelIndexData *)(pQVar3->index).i;
          }
          local_f8 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_100 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          if (local_d8 == (QAbstractItemModel *)0x0) {
            local_108 = (undefined1 *)0xffffffffffffffff;
            pQStack_100 = (QPersistentModelIndexData *)0x0;
            local_f8 = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_d8 + 0x68))(&local_108,local_d8,&local_e8);
          }
          local_118 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_120 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
          if (local_88 == (QAbstractItemModel *)0x0) {
            local_128 = (undefined1 *)0xffffffffffffffff;
            pQStack_120 = (QPersistentModelIndexData *)0x0;
            local_118 = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_88 + 0x68))(&local_128,local_88,&local_98);
          }
          bVar9 = (int)(local_98._4_4_ | (uint)local_98) < 0;
          uVar18 = uVar17;
          if (bVar9) {
LAB_005b20b3:
            bVar9 = QItemSelectionRange::isValid(&local_a8);
            if (bVar9) {
              QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                        ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_a8)
              ;
              QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
            }
            if (local_c8.size == 0) {
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_158._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_158.i = 0;
                local_158.m.ptr = (QAbstractItemModel *)0x0;
              }
              else if (local_e8._4_4_ == iVar1) {
                local_158.m.ptr = local_d8;
                local_158._0_8_ = local_e8;
                local_158.i = (quintptr)pQStack_e0;
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x70))
                          (&local_158,local_d8,(ulong)local_e8 & 0xffffffff,iVar1,&local_e8);
              }
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_178._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_178.i = 0;
                local_178.m.ptr = (QAbstractItemModel *)0x0;
              }
              else if (local_e8._4_4_ == iVar2) {
                local_178.m.ptr = local_d8;
                local_178._0_8_ = local_e8;
                local_178.i = (quintptr)pQStack_e0;
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x70))
                          (&local_178,local_d8,(ulong)local_e8 & 0xffffffff,iVar2,&local_e8);
              }
              QPersistentModelIndex::QPersistentModelIndex(&local_138,&local_158);
              QPersistentModelIndex::QPersistentModelIndex(&QStack_130,&local_178);
              pQVar5 = (QPersistentModelIndexData *)CONCAT44(local_138.d._4_4_,local_138.d._0_4_);
              pQVar6 = (QPersistentModelIndexData *)CONCAT44(QStack_130.d._4_4_,QStack_130.d._0_4_);
              local_138.d._0_4_ = local_a8.tl.d._0_4_;
              local_138.d._4_4_ = local_a8.tl.d._4_4_;
              QStack_130.d._0_4_ = local_a8.br.d._0_4_;
              QStack_130.d._4_4_ = local_a8.br.d._4_4_;
              local_a8.tl.d = pQVar5;
              local_a8.br.d = pQVar6;
              QPersistentModelIndex::~QPersistentModelIndex(&QStack_130);
              QPersistentModelIndex::~QPersistentModelIndex(&local_138);
            }
            else {
              QList<QItemSelectionRange>::takeLast((QList<QItemSelectionRange> *)&local_158);
              QVar8.d = local_a8.br.d;
              QVar7.d = local_a8.tl.d;
              local_a8.tl.d = (QPersistentModelIndexData *)local_158._0_8_;
              local_a8.br.d = (QPersistentModelIndexData *)local_158.i;
              local_158._0_8_ = QVar7.d;
              local_158.i = (quintptr)QVar8.d;
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_158.i);
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_158);
              QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,&local_a8.br);
              local_d8 = local_158.m.ptr;
              local_e8 = (QPersistentModelIndexData *)local_158._0_8_;
              pQStack_e0 = (QPersistentModelIndexData *)local_158.i;
              uVar18 = uVar17 - 1;
            }
          }
          else {
            if (local_88 == (QAbstractItemModel *)0x0) {
LAB_005b204c:
              if ((!bVar9) && (local_88 != (QAbstractItemModel *)0x0)) {
                pQVar4 = (this->super_QAbstractItemViewPrivate).model;
                (**(code **)(*(long *)pQVar4 + 0x60))
                          (&local_158,pQVar4,(ulong)local_98 & 0xffffffff,0,&local_128);
                if ((int)local_108 == local_158.r) {
                  if (((local_108._4_4_ == local_158.c) &&
                      (pQStack_100 == (QPersistentModelIndexData *)local_158.i)) &&
                     (local_f8 == local_158.m.ptr)) {
                    QtPrivate::QMovableArrayOps<QItemSelectionRange>::
                    emplace<QItemSelectionRange_const&>
                              ((QMovableArrayOps<QItemSelectionRange> *)&local_c8,local_c8.size,
                               &local_a8);
                    this_01 = &local_c8;
LAB_005b23b7:
                    QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)this_01);
                    goto LAB_005b23bc;
                  }
                }
              }
              goto LAB_005b20b3;
            }
            if ((int)local_108 != (int)local_128) goto LAB_005b204c;
            if (((local_108._4_4_ != local_128._4_4_) || (pQStack_100 != pQStack_120)) ||
               (local_f8 != local_118)) goto LAB_005b204c;
            uVar16 = (uint)local_98 - (int)local_e8;
            uVar17 = -uVar16;
            if (0 < (int)uVar16) {
              uVar17 = uVar16;
            }
            if (uVar17 < 2) {
              local_158.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_158.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
              pQVar4 = (this->super_QAbstractItemViewPrivate).model;
              uVar12 = QPersistentModelIndex::row();
              uVar13 = QPersistentModelIndex::column();
              QPersistentModelIndex::parent();
              (**(code **)(*(long *)pQVar4 + 0x60))(&local_158,pQVar4,uVar12,uVar13,&local_178);
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_178._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_178.i = 0;
                local_178.m.ptr = (QAbstractItemModel *)0x0;
              }
              else if (local_e8._4_4_ == iVar2) {
                local_178.m.ptr = local_d8;
                local_178._0_8_ = local_e8;
                local_178.i = (quintptr)pQStack_e0;
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x70))
                          (&local_178,local_d8,(ulong)local_e8 & 0xffffffff,iVar2,&local_e8);
              }
            }
            else {
              bVar9 = QItemSelectionRange::isValid(&local_a8);
              if (bVar9) {
                QtPrivate::QMovableArrayOps<QItemSelectionRange>::
                emplace<QItemSelectionRange_const&>
                          ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,
                           &local_a8);
                this_01 = &local_58;
                goto LAB_005b23b7;
              }
LAB_005b23bc:
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_158._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_158.i = 0;
                local_158.m.ptr = (QAbstractItemModel *)0x0;
              }
              else if (local_e8._4_4_ == iVar1) {
                local_158.m.ptr = local_d8;
                local_158._0_8_ = local_e8;
                local_158.i = (quintptr)pQStack_e0;
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x70))
                          (&local_158,local_d8,(ulong)local_e8 & 0xffffffff,iVar1,&local_e8);
              }
              if (local_d8 == (QAbstractItemModel *)0x0) {
                local_178._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_178.i = 0;
                local_178.m.ptr = (QAbstractItemModel *)0x0;
              }
              else if (local_e8._4_4_ == iVar2) {
                local_178.m.ptr = local_d8;
                local_178._0_8_ = local_e8;
                local_178.i = (quintptr)pQStack_e0;
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x70))
                          (&local_178,local_d8,(ulong)local_e8 & 0xffffffff,iVar2,&local_e8);
              }
            }
            QPersistentModelIndex::QPersistentModelIndex(&local_138,&local_158);
            QPersistentModelIndex::QPersistentModelIndex(&QStack_130,&local_178);
            pQVar5 = (QPersistentModelIndexData *)CONCAT44(local_138.d._4_4_,local_138.d._0_4_);
            pQVar6 = (QPersistentModelIndexData *)CONCAT44(QStack_130.d._4_4_,QStack_130.d._0_4_);
            local_138.d._0_4_ = local_a8.tl.d._0_4_;
            local_138.d._4_4_ = local_a8.tl.d._4_4_;
            QStack_130.d._0_4_ = local_a8.br.d._0_4_;
            QStack_130.d._4_4_ = local_a8.br.d._4_4_;
            local_a8.tl.d = pQVar5;
            local_a8.br.d = pQVar6;
            QPersistentModelIndex::~QPersistentModelIndex(&QStack_130);
            QPersistentModelIndex::~QPersistentModelIndex(&local_138);
          }
          local_88 = local_d8;
          local_98 = local_e8;
          pQStack_90 = pQStack_e0;
          uVar17 = uVar18 + 1;
        } while ((int)uVar18 < iVar11);
      }
      bVar9 = QItemSelectionRange::isValid(&local_a8);
      if (bVar9) {
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,&local_a8);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
      }
      if (local_c8.size != 0) {
        lVar19 = 0;
        uVar20 = 0;
        do {
          QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                    ((QMovableArrayOps<QItemSelectionRange> *)&local_58,local_58.size,
                     (QItemSelectionRange *)((long)&((local_c8.ptr)->tl).d + lVar19));
          QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_58);
          uVar20 = uVar20 + 1;
          lVar19 = lVar19 + 0x10;
        } while (uVar20 < (ulong)local_c8.size);
      }
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_c8);
      QPersistentModelIndex::~QPersistentModelIndex(&local_a8.br);
      QPersistentModelIndex::~QPersistentModelIndex(&local_a8.tl);
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != local_78.d.ptr + local_78.d.size);
  }
  pQVar14 = QAbstractItemView::selectionModel(this_00);
  (**(code **)(*(long *)pQVar14 + 0x70))(pQVar14,&local_58,(int)__writefds);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTreeViewPrivate::select(const QModelIndex &topIndex, const QModelIndex &bottomIndex,
                              QItemSelectionModel::SelectionFlags command)
{
    Q_Q(QTreeView);
    QItemSelection selection;
    const int top = viewIndex(topIndex),
        bottom = viewIndex(bottomIndex);

    const QList<std::pair<int, int>> colRanges = columnRanges(topIndex, bottomIndex);
    QList<std::pair<int, int>>::const_iterator it;
    for (it = colRanges.begin(); it != colRanges.end(); ++it) {
        const int left = (*it).first,
            right = (*it).second;

        QModelIndex previous;
        QItemSelectionRange currentRange;
        QStack<QItemSelectionRange> rangeStack;
        for (int i = top; i <= bottom; ++i) {
            QModelIndex index = modelIndex(i);
            QModelIndex parent = index.parent();
            QModelIndex previousParent = previous.parent();
            if (previous.isValid() && parent == previousParent) {
                // same parent
                if (qAbs(previous.row() - index.row()) > 1) {
                    //a hole (hidden index inside a range) has been detected
                    if (currentRange.isValid()) {
                        selection.append(currentRange);
                    }
                    //let's start a new range
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    QModelIndex tl = model->index(currentRange.top(), currentRange.left(),
                        currentRange.parent());
                    currentRange = QItemSelectionRange(tl, index.sibling(index.row(), right));
                }
            } else if (previous.isValid() && parent == model->index(previous.row(), 0, previousParent)) {
                // item is child of previous
                rangeStack.push(currentRange);
                currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
            } else {
                if (currentRange.isValid())
                    selection.append(currentRange);
                if (rangeStack.isEmpty()) {
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    currentRange = rangeStack.pop();
                    index = currentRange.bottomRight(); //let's resume the range
                    --i; //we process again the current item
                }
            }
            previous = index;
        }
        if (currentRange.isValid())
            selection.append(currentRange);
        for (int i = 0; i < rangeStack.size(); ++i)
            selection.append(rangeStack.at(i));
    }
    q->selectionModel()->select(selection, command);
}